

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decompressSequences_default
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  seq_t sequence_00;
  ZSTD_seqSymbol *pZVar3;
  ZSTD_longOffset_e ZVar4;
  BYTE *pBVar5;
  ZSTD_seqSymbol ZVar6;
  uint uVar7;
  BIT_DStream_status BVar8;
  BYTE *pBVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  size_t __n;
  ulong uVar13;
  bool local_4ca;
  undefined1 *local_4c8;
  uint local_4a4;
  int nbSeq_local;
  size_t seqSize_local;
  void *seqStart_local;
  size_t maxDstSize_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  size_t lastLLSize;
  U32 i_1;
  size_t oneSeqSize;
  seq_t sequence;
  undefined1 auStack_438 [4];
  U32 i;
  seqState_t seqState;
  BYTE *dictEnd;
  BYTE *vBase;
  BYTE *prefixStart;
  BYTE *litEnd;
  BYTE *litPtr;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  ZSTD_longOffset_e local_370;
  int local_36c;
  size_t local_368;
  void *local_360;
  size_t local_358;
  void *local_350;
  ZSTD_DCtx *local_348;
  BYTE *local_340;
  undefined4 local_334;
  ZSTD_seqSymbol *pZStack_330;
  int kUseUpdateFseState;
  size_t temp;
  U32 ll0;
  U32 extraBits;
  size_t offset;
  uint local_310;
  BYTE totalBits;
  BYTE ofBits;
  BYTE mlBits;
  BYTE llBits;
  U32 ofBase;
  U32 mlBase;
  U32 llBase;
  ZSTD_seqSymbol ofDInfo;
  ZSTD_seqSymbol mlDInfo;
  ZSTD_seqSymbol llDInfo;
  size_t local_2d8;
  size_t length1;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oend_w;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *local_288;
  BYTE *local_280;
  BYTE *local_278;
  BYTE **local_270;
  BYTE *local_268;
  BYTE *local_260;
  BYTE *local_258;
  ulong local_250;
  size_t lowBits_2;
  BIT_DStream_t *pBStack_240;
  U32 nbBits_2;
  ZSTD_seqSymbol **local_238;
  undefined8 local_230;
  ulong local_228;
  size_t value_2;
  BIT_DStream_t *local_218;
  uint local_20c;
  BIT_DStream_t *local_208;
  uint local_1fc;
  BIT_DStream_t *local_1f8;
  undefined4 local_1ec;
  uint local_1e8;
  U32 regMask_2;
  ulong local_1d8;
  size_t lowBits_1;
  BIT_DStream_t *pBStack_1c8;
  U32 nbBits_1;
  ZSTD_seqSymbol **local_1c0;
  ZSTD_seqSymbol local_1b8;
  ulong local_1b0;
  size_t value_1;
  BIT_DStream_t *local_1a0;
  uint local_194;
  BIT_DStream_t *local_190;
  uint local_184;
  BIT_DStream_t *local_180;
  undefined4 local_174;
  uint local_170;
  U32 regMask_1;
  ulong local_160;
  size_t lowBits;
  BIT_DStream_t *pBStack_150;
  U32 nbBits;
  char **local_148;
  undefined8 local_140;
  ulong local_138;
  size_t value;
  BIT_DStream_t *local_128;
  uint local_11c;
  BIT_DStream_t *local_118;
  uint local_10c;
  BIT_DStream_t *local_108;
  undefined4 local_fc;
  uint local_f8;
  U32 regMask;
  BYTE *local_e8;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  ulong local_80;
  size_t local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  long local_40;
  size_t local_38;
  BYTE *local_30;
  int local_24;
  ZSTD_seqSymbol *pZStack_20;
  int sub2;
  size_t *local_18;
  BYTE **local_10;
  
  local_370 = isLongOffset;
  ip._4_4_ = frame;
  ostart = (BYTE *)((long)seqStart + seqSize);
  op = (BYTE *)((long)dst + maxDstSize);
  litEnd = dctx->litPtr;
  pBVar9 = litEnd + dctx->litSize;
  pBVar1 = (BYTE *)dctx->prefixStart;
  pBVar2 = (BYTE *)dctx->virtualStart;
  seqState.prevOffset[2] = (size_t)dctx->dictEnd;
  litPtr = (BYTE *)dst;
  oend = (BYTE *)dst;
  iend = (BYTE *)seqStart;
  local_36c = nbSeq;
  local_368 = seqSize;
  local_360 = seqStart;
  local_358 = maxDstSize;
  local_350 = dst;
  local_348 = dctx;
  if (nbSeq != 0) {
    dctx->fseEntropy = 1;
    for (sequence.offset._4_4_ = 0; sequence.offset._4_4_ < 3;
        sequence.offset._4_4_ = sequence.offset._4_4_ + 1) {
      seqState.prevOffset[(ulong)sequence.offset._4_4_ - 1] =
           (ulong)(dctx->entropy).rep[sequence.offset._4_4_];
    }
    sVar10 = BIT_initDStream((BIT_DStream_t *)auStack_438,seqStart,(long)ostart - (long)seqStart);
    uVar7 = ERR_isError(sVar10);
    if (uVar7 != 0) {
      return 0xffffffffffffffec;
    }
    ZSTD_initFseState((ZSTD_fseState *)&seqState.DStream.limitPtr,(BIT_DStream_t *)auStack_438,
                      local_348->LLTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateLL.table,(BIT_DStream_t *)auStack_438,
                      local_348->OFTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateOffb.table,(BIT_DStream_t *)auStack_438,
                      local_348->MLTptr);
    do {
      ZVar4 = local_370;
      sVar10 = seqState.prevOffset[0];
      uVar13 = *(ulong *)(seqState.stateLL.state + (long)seqState.DStream.limitPtr * 8);
      ofDInfo = *(ZSTD_seqSymbol *)(seqState.stateML.state + (long)seqState.stateOffb.table * 8);
      uVar11 = *(ulong *)(seqState.stateOffb.state + (long)seqState.stateLL.table * 8);
      mlDInfo.baseValue = (U32)(uVar13 >> 0x20);
      ofBase = mlDInfo.baseValue;
      _totalBits = ofDInfo.baseValue;
      llBase = (U32)(uVar11 >> 0x20);
      local_310 = llBase;
      mlDInfo.nbAdditionalBits = (BYTE)(uVar13 >> 0x10);
      offset._7_1_ = mlDInfo.nbAdditionalBits;
      offset._6_1_ = ofDInfo.nbAdditionalBits;
      mlBase._2_1_ = (byte)(uVar11 >> 0x10);
      offset._5_1_ = mlBase._2_1_;
      offset._4_1_ = mlDInfo.nbAdditionalBits + ofDInfo.nbAdditionalBits + mlBase._2_1_;
      _mlBase = uVar11;
      if (mlBase._2_1_ < 2) {
        temp._0_4_ = (uint)(mlDInfo.baseValue == 0);
        if (mlBase._2_1_ == 0) {
          if ((uint)temp != 0) {
            seqState.prevOffset[0] = (size_t)seqState.stateML.table;
            seqState.stateML.table = (ZSTD_seqSymbol *)sVar10;
          }
        }
        else {
          uVar7 = llBase + (uint)temp;
          sVar10 = BIT_readBitsFast((BIT_DStream_t *)auStack_438,1);
          lVar12 = uVar7 + sVar10;
          if (lVar12 == 3) {
            local_4c8 = (undefined1 *)((long)&seqState.stateML.table[-1].baseValue + 3);
          }
          else {
            local_4c8 = (undefined1 *)seqState.prevOffset[lVar12 + -1];
          }
          pZStack_330 = (ZSTD_seqSymbol *)
                        (local_4c8 + (int)(uint)((local_4c8 != (undefined1 *)0x0 ^ 0xffU) & 1));
          if (lVar12 != 1) {
            seqState.prevOffset[1] = seqState.prevOffset[0];
          }
          seqState.prevOffset[0] = (size_t)seqState.stateML.table;
          seqState.stateML.table = pZStack_330;
        }
      }
      else {
        uVar7 = MEM_32bits();
        if (((uVar7 == 0) || (ZVar4 == ZSTD_lo_isRegularOffset)) || (offset._5_1_ < 0x19)) {
          uVar11 = (ulong)local_310;
          sVar10 = BIT_readBitsFast((BIT_DStream_t *)auStack_438,(uint)offset._5_1_);
          _ll0 = (ZSTD_seqSymbol *)(uVar11 + sVar10);
          uVar7 = MEM_32bits();
          if (uVar7 != 0) {
            BIT_reloadDStream((BIT_DStream_t *)auStack_438);
          }
        }
        else {
          if ((uint)offset._5_1_ < 0x20U - (int)seqState.DStream.bitContainer) {
            local_4a4 = (uint)offset._5_1_;
          }
          else {
            local_4a4 = 0x20 - (int)seqState.DStream.bitContainer;
          }
          temp._4_4_ = offset._5_1_ - local_4a4;
          uVar11 = (ulong)local_310;
          sVar10 = BIT_readBitsFast((BIT_DStream_t *)auStack_438,offset._5_1_ - temp._4_4_);
          _ll0 = (ZSTD_seqSymbol *)(uVar11 + (sVar10 << ((byte)temp._4_4_ & 0x3f)));
          BIT_reloadDStream((BIT_DStream_t *)auStack_438);
          if (temp._4_4_ != 0) {
            sVar10 = BIT_readBitsFast((BIT_DStream_t *)auStack_438,temp._4_4_);
            _ll0 = (ZSTD_seqSymbol *)((long)&_ll0->nextState + sVar10);
          }
        }
        seqState.prevOffset[1] = seqState.prevOffset[0];
        seqState.prevOffset[0] = (size_t)seqState.stateML.table;
        seqState.stateML.table = _ll0;
      }
      pZVar3 = seqState.stateML.table;
      sequence.litLength = (size_t)_totalBits;
      _ll0 = seqState.stateML.table;
      if (offset._6_1_ != 0) {
        sVar10 = BIT_readBitsFast((BIT_DStream_t *)auStack_438,(uint)offset._6_1_);
        sequence.litLength = sVar10 + sequence.litLength;
      }
      uVar7 = MEM_32bits();
      if ((uVar7 != 0) && (0x13 < (uint)offset._6_1_ + (uint)offset._7_1_)) {
        BIT_reloadDStream((BIT_DStream_t *)auStack_438);
      }
      uVar7 = MEM_64bits();
      if ((uVar7 != 0) && (0x1e < offset._4_1_)) {
        BIT_reloadDStream((BIT_DStream_t *)auStack_438);
      }
      oneSeqSize = (size_t)ofBase;
      if (offset._7_1_ != 0) {
        sVar10 = BIT_readBitsFast((BIT_DStream_t *)auStack_438,(uint)offset._7_1_);
        oneSeqSize = sVar10 + oneSeqSize;
      }
      uVar7 = MEM_32bits();
      if (uVar7 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)auStack_438);
      }
      local_334 = 0;
      local_148 = &seqState.DStream.limitPtr;
      local_140._3_1_ = (byte)(uVar13 >> 0x18);
      lowBits._4_4_ = (uint)local_140._3_1_;
      regMask = (0x40 - (int)seqState.DStream.bitContainer) - lowBits._4_4_;
      local_fc = 0x3f;
      local_160 = _auStack_438 >> ((byte)regMask & 0x3f) & (ulong)BIT_mask[lowBits._4_4_];
      seqState.DStream.limitPtr = (char *)((uVar13 & 0xffff) + local_160);
      local_1c0 = &seqState.stateOffb.table;
      local_1b8 = ofDInfo;
      ZVar6 = local_1b8;
      local_1b8.nbBits = ofDInfo.nbBits;
      lowBits_1._4_4_ = (uint)local_1b8.nbBits;
      regMask_1 = (0x40 - (lowBits._4_4_ + (int)seqState.DStream.bitContainer)) - lowBits_1._4_4_;
      local_174 = 0x3f;
      local_1d8 = _auStack_438 >> ((byte)regMask_1 & 0x3f) & (ulong)BIT_mask[lowBits_1._4_4_];
      seqState.DStream.bitContainer._0_4_ =
           lowBits_1._4_4_ + lowBits._4_4_ + (int)seqState.DStream.bitContainer;
      seqState.stateOffb.table = (ZSTD_seqSymbol *)(((ulong)ofDInfo & 0xffff) + local_1d8);
      pBStack_1c8 = (BIT_DStream_t *)auStack_438;
      local_1b8 = ZVar6;
      local_1b0 = local_1d8;
      value_1._4_4_ = lowBits_1._4_4_;
      local_1a0 = (BIT_DStream_t *)auStack_438;
      local_194 = lowBits_1._4_4_;
      local_190 = (BIT_DStream_t *)auStack_438;
      local_184 = lowBits_1._4_4_;
      local_180 = (BIT_DStream_t *)auStack_438;
      local_170 = lowBits_1._4_4_;
      pBStack_150 = (BIT_DStream_t *)auStack_438;
      local_140 = uVar13;
      local_138 = local_160;
      value._4_4_ = lowBits._4_4_;
      local_128 = (BIT_DStream_t *)auStack_438;
      local_11c = lowBits._4_4_;
      local_118 = (BIT_DStream_t *)auStack_438;
      local_10c = lowBits._4_4_;
      local_108 = (BIT_DStream_t *)auStack_438;
      local_f8 = lowBits._4_4_;
      uVar7 = MEM_32bits();
      if (uVar7 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)auStack_438);
      }
      local_238 = &seqState.stateLL.table;
      local_230 = _mlBase;
      uVar13 = local_230;
      local_230._3_1_ = (byte)(_mlBase >> 0x18);
      lowBits_2._4_4_ = (uint)local_230._3_1_;
      regMask_2 = (0x40 - (int)seqState.DStream.bitContainer) - lowBits_2._4_4_;
      local_1ec = 0x3f;
      local_250 = _auStack_438 >> ((byte)regMask_2 & 0x3f) & (ulong)BIT_mask[lowBits_2._4_4_];
      seqState.DStream.bitContainer._0_4_ = lowBits_2._4_4_ + (int)seqState.DStream.bitContainer;
      seqState.stateLL.table = (ZSTD_seqSymbol *)((_mlBase & 0xffff) + local_250);
      local_2d8 = sequence.litLength;
      local_260 = litPtr;
      local_268 = op;
      local_270 = &litEnd;
      oLitEnd = (BYTE *)seqState.prevOffset[2];
      sequenceLength = (size_t)(litPtr + oneSeqSize);
      oMatchEnd = (BYTE *)(oneSeqSize + sequence.litLength);
      oend_w = litPtr + (long)oMatchEnd;
      iLitEnd = op + -0x20;
      match = litEnd + oneSeqSize;
      length1 = sequenceLength - (long)pZVar3;
      local_4ca = true;
      local_288 = pBVar2;
      local_280 = pBVar1;
      local_278 = pBVar9;
      pBStack_240 = (BIT_DStream_t *)auStack_438;
      local_230 = uVar13;
      local_228 = local_250;
      value_2._4_4_ = lowBits_2._4_4_;
      local_218 = (BIT_DStream_t *)auStack_438;
      local_20c = lowBits_2._4_4_;
      local_208 = (BIT_DStream_t *)auStack_438;
      local_1fc = lowBits_2._4_4_;
      local_1f8 = (BIT_DStream_t *)auStack_438;
      local_1e8 = lowBits_2._4_4_;
      if ((match <= pBVar9) && (local_4ca = true, oend_w <= iLitEnd)) {
        uVar7 = MEM_32bits();
        local_4ca = uVar7 != 0 && local_268 + -(long)local_260 < oMatchEnd + 0x20;
      }
      if (local_4ca) {
        sequence_00.matchLength = sequence.litLength;
        sequence_00.litLength = oneSeqSize;
        sequence_00.offset = (size_t)pZVar3;
        local_258 = (BYTE *)ZSTD_execSequenceEnd
                                      (local_260,local_268,sequence_00,local_270,local_278,local_280
                                       ,local_288,oLitEnd);
      }
      else {
        ZSTD_copy16(local_260,*local_270);
        if (0x10 < oneSeqSize) {
          oend_1 = local_260 + 0x10;
          op_1 = *local_270 + 0x10;
          local_c0 = oneSeqSize - 0x10;
          diff._4_4_ = 0;
          ip_1 = oend_1 + -(long)op_1;
          local_e8 = oend_1 + local_c0;
          local_b8 = op_1;
          local_b0 = oend_1;
          ZSTD_copy16(oend_1,op_1);
          if (0x10 < local_c0) {
            oend_1 = oend_1 + 0x10;
            op_1 = op_1 + 0x10;
            do {
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
            } while (oend_1 < local_e8);
          }
        }
        local_260 = (BYTE *)sequenceLength;
        *local_270 = match;
        if ((ZSTD_seqSymbol *)(sequenceLength - (long)local_280) < pZVar3) {
          if ((ZSTD_seqSymbol *)(sequenceLength - (long)local_288) < pZVar3) {
            local_258 = (BYTE *)0xffffffffffffffec;
          }
          else {
            length1 = (size_t)(oLitEnd + (length1 - (long)local_280));
            if (oLitEnd < (BYTE *)(length1 + sequence.litLength)) {
              __n = (long)oLitEnd - length1;
              memmove((void *)sequenceLength,(void *)length1,__n);
              local_260 = (BYTE *)(sequenceLength + __n);
              local_2d8 = sequence.litLength - __n;
              length1 = (size_t)local_280;
              goto LAB_00372871;
            }
            memmove((void *)sequenceLength,(void *)length1,sequence.litLength);
            local_258 = oMatchEnd;
          }
        }
        else {
LAB_00372871:
          if (pZVar3 < (ZSTD_seqSymbol *)0x10) {
            local_10 = &local_260;
            local_18 = &length1;
            pZStack_20 = pZVar3;
            if (pZVar3 < (ZSTD_seqSymbol *)0x8) {
              local_24 = *(int *)(ZSTD_overlapCopy8_dec64table + (long)pZVar3 * 4);
              *local_260 = *(BYTE *)length1;
              local_260[1] = *(BYTE *)(length1 + 1);
              local_260[2] = *(BYTE *)(length1 + 2);
              local_260[3] = *(BYTE *)(length1 + 3);
              length1 = length1 + *(uint *)(ZSTD_overlapCopy8_dec32table + (long)pZVar3 * 4);
              ZSTD_copy4(local_260 + 4,(void *)length1);
              *local_18 = *local_18 - (long)local_24;
            }
            else {
              ZSTD_copy8(local_260,(void *)length1);
            }
            *local_18 = *local_18 + 8;
            *local_10 = *local_10 + 8;
            if (8 < local_2d8) {
              local_40 = local_2d8 - 8;
              local_30 = local_260;
              local_38 = length1;
              diff_2._4_4_ = 1;
              ip_3 = local_260 + -length1;
              op_3 = (BYTE *)length1;
              oend_3 = local_260;
              local_68 = local_260 + local_40;
              if ((long)ip_3 < 0x10) {
                do {
                  ZSTD_copy8(oend_3,op_3);
                  oend_3 = oend_3 + 8;
                  op_3 = op_3 + 8;
                } while (oend_3 < local_68);
              }
              else {
                ZSTD_copy16(local_260,(void *)length1);
                if (0x10 < local_40) {
                  oend_3 = oend_3 + 0x10;
                  op_3 = op_3 + 0x10;
                  do {
                    ZSTD_copy16(oend_3,op_3);
                    oend_3 = oend_3 + 0x10;
                    op_3 = op_3 + 0x10;
                    ZSTD_copy16(oend_3,op_3);
                    oend_3 = oend_3 + 0x10;
                    op_3 = op_3 + 0x10;
                  } while (oend_3 < local_68);
                }
              }
            }
            local_258 = oMatchEnd;
          }
          else {
            local_70 = local_260;
            local_78 = length1;
            local_80 = local_2d8;
            diff_1._4_4_ = 0;
            ip_2 = local_260 + -length1;
            op_2 = (BYTE *)length1;
            oend_2 = local_260;
            local_a8 = local_260 + local_2d8;
            ZSTD_copy16(local_260,(void *)length1);
            if (0x10 < (long)local_80) {
              oend_2 = oend_2 + 0x10;
              op_2 = op_2 + 0x10;
              do {
                ZSTD_copy16(oend_2,op_2);
                oend_2 = oend_2 + 0x10;
                op_2 = op_2 + 0x10;
                ZSTD_copy16(oend_2,op_2);
                oend_2 = oend_2 + 0x10;
                op_2 = op_2 + 0x10;
              } while (oend_2 < local_a8);
            }
            local_258 = oMatchEnd;
          }
        }
      }
      pBVar5 = local_258;
      uVar7 = ERR_isError((size_t)local_258);
      if (uVar7 != 0) {
        return (size_t)pBVar5;
      }
      litPtr = pBVar5 + (long)litPtr;
      local_36c = local_36c + -1;
      if (local_36c == 0) goto LAB_00372cfa;
      BIT_reloadDStream((BIT_DStream_t *)auStack_438);
    } while( true );
  }
LAB_00372d65:
  uVar13 = (long)pBVar9 - (long)litEnd;
  if ((ulong)((long)op - (long)litPtr) < uVar13) {
    local_340 = (BYTE *)0xffffffffffffffba;
  }
  else {
    if (litPtr != (BYTE *)0x0) {
      memcpy(litPtr,litEnd,uVar13);
      litPtr = litPtr + uVar13;
    }
    local_340 = litPtr + -(long)oend;
  }
  return (size_t)local_340;
LAB_00372cfa:
  BVar8 = BIT_reloadDStream((BIT_DStream_t *)auStack_438);
  if (BVar8 < BIT_DStream_completed) {
    return 0xffffffffffffffec;
  }
  for (lastLLSize._4_4_ = 0; lastLLSize._4_4_ < 3; lastLLSize._4_4_ = lastLLSize._4_4_ + 1) {
    (local_348->entropy).rep[lastLLSize._4_4_] =
         (U32)seqState.prevOffset[(ulong)lastLLSize._4_4_ - 1];
  }
  goto LAB_00372d65;
}

Assistant:

static size_t
ZSTD_decompressSequences_default(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset,
                           const int frame)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}